

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void helics::apps::brokerConnectionList(ConnectionsList *connections,json *broker)

{
  value_t vVar1;
  bool bVar2;
  reference pbVar3;
  iterator __begin2;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_68;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_48;
  
  local_68.m_object =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)broker,"brokers");
  local_68.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_68.m_it.array_iterator._M_current = (pointer)0x0;
  local_68.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = ((local_68.m_object)->m_data).m_type;
  if (vVar1 == null) {
    local_68.m_it.primitive_iterator.m_it = 1;
LAB_001f40f0:
    local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_48.m_it.array_iterator._M_current = (pointer)0x0;
    local_48.m_it.primitive_iterator.m_it = 1;
  }
  else if (vVar1 == array) {
    local_68.m_it.array_iterator._M_current =
         ((((local_68.m_object)->m_data).m_value.array)->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_48.m_it.array_iterator._M_current =
         ((((local_68.m_object)->m_data).m_value.array)->
         super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (vVar1 != object) {
      local_68.m_it.primitive_iterator.m_it = 0;
      goto LAB_001f40f0;
    }
    local_68.m_it.object_iterator._M_node =
         (_Base_ptr)(((local_68.m_object)->m_data).m_value.binary)->m_subtype;
    local_48.m_it.array_iterator._M_current = (pointer)0x0;
    local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_48.m_it.object_iterator._M_node =
         &((((local_68.m_object)->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
          _M_header;
  }
  local_48.m_object = local_68.m_object;
  bVar2 = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::
          operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                    (&local_68,&local_48);
  if (!bVar2) {
    do {
      pbVar3 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&local_68);
      brokerConnectionList(connections,pbVar3);
      vVar1 = ((local_68.m_object)->m_data).m_type;
      if (vVar1 == array) {
        local_68.m_it.array_iterator._M_current = local_68.m_it.array_iterator._M_current + 1;
      }
      else if (vVar1 == object) {
        local_68.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_68.m_it.object_iterator._M_node);
      }
      else {
        local_68.m_it.primitive_iterator.m_it = local_68.m_it.primitive_iterator.m_it + 1;
      }
      bVar2 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_68,&local_48);
    } while (!bVar2);
  }
  local_68.m_object =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)broker,"cores");
  local_68.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_68.m_it.array_iterator._M_current = (pointer)0x0;
  local_68.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = ((local_68.m_object)->m_data).m_type;
  if (vVar1 == null) {
    local_68.m_it.primitive_iterator.m_it = 1;
  }
  else {
    if (vVar1 == array) {
      local_68.m_it.array_iterator._M_current =
           ((((local_68.m_object)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_48.m_it.array_iterator._M_current =
           ((((local_68.m_object)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_001f4222;
    }
    if (vVar1 == object) {
      local_68.m_it.object_iterator._M_node =
           (_Base_ptr)(((local_68.m_object)->m_data).m_value.binary)->m_subtype;
      local_48.m_it.array_iterator._M_current = (pointer)0x0;
      local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_48.m_it.object_iterator._M_node =
           &((((local_68.m_object)->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
            _M_header;
      goto LAB_001f4222;
    }
    local_68.m_it.primitive_iterator.m_it = 0;
  }
  local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_48.m_it.array_iterator._M_current = (pointer)0x0;
  local_48.m_it.primitive_iterator.m_it = 1;
LAB_001f4222:
  local_48.m_object = local_68.m_object;
  bVar2 = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::
          operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                    (&local_68,&local_48);
  if (!bVar2) {
    do {
      pbVar3 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&local_68);
      coreConnectionList(connections,pbVar3);
      vVar1 = ((local_68.m_object)->m_data).m_type;
      if (vVar1 == array) {
        local_68.m_it.array_iterator._M_current = local_68.m_it.array_iterator._M_current + 1;
      }
      else if (vVar1 == object) {
        local_68.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_68.m_it.object_iterator._M_node);
      }
      else {
        local_68.m_it.primitive_iterator.m_it = local_68.m_it.primitive_iterator.m_it + 1;
      }
      bVar2 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_68,&local_48);
    } while (!bVar2);
  }
  return;
}

Assistant:

static void brokerConnectionList(ConnectionsList& connections, nlohmann::json& broker)
{
    for (auto& subBroker : broker["brokers"]) {
        brokerConnectionList(connections, subBroker);
    }
    for (auto& core : broker["cores"]) {
        coreConnectionList(connections, core);
    }
}